

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O2

void BZ2_bzReadClose(int *bzerror,BZFILE *b)

{
  if (bzerror == (int *)0x0) {
    if (b == (BZFILE *)0x0) {
      return;
    }
    *(undefined4 *)((long)b + 0x13e8) = 0;
    if (*(char *)((long)b + 0x1394) == '\0') goto LAB_004db1c0;
  }
  else {
    *bzerror = 0;
    if (b == (BZFILE *)0x0) {
      return;
    }
    *(undefined4 *)((long)b + 0x13e8) = 0;
    if (*(char *)((long)b + 0x1394) == '\0') {
LAB_004db1c0:
      if (*(char *)((long)b + 0x13ec) != '\0') {
        BZ2_bzDecompressEnd((bz_stream *)((long)b + 0x1398));
      }
      free(b);
      return;
    }
    *bzerror = -1;
  }
  *(undefined4 *)((long)b + 0x13e8) = 0xffffffff;
  return;
}

Assistant:

void BZ_API(BZ2_bzReadClose) ( int *bzerror, BZFILE *b )
{
   bzFile* bzf = (bzFile*)b;

   BZ_SETERR(BZ_OK);
   if (bzf == NULL)
      { BZ_SETERR(BZ_OK); return; };

   if (bzf->writing)
      { BZ_SETERR(BZ_SEQUENCE_ERROR); return; };

   if (bzf->initialisedOk)
      (void)BZ2_bzDecompressEnd ( &(bzf->strm) );
   free ( bzf );
}